

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O3

FT_Error BDF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  FT_Face pFVar7;
  long lVar8;
  FT_Byte *buffer;
  FT_Error FVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar16;
  undefined1 auVar15 [16];
  
  pFVar7 = size->face;
  FVar9 = 6;
  if (glyph_index < (uint)pFVar7->num_glyphs) {
    uVar3 = *(undefined2 *)(pFVar7[1].face_flags + 0x880f2);
    if (glyph_index == 0) {
      uVar11 = pFVar7[1].num_fixed_sizes;
    }
    else {
      uVar11 = glyph_index - 1;
    }
    lVar8 = *(long *)(pFVar7[1].face_flags + 0x60);
    lVar10 = (ulong)uVar11 * 0x38;
    uVar4 = *(ushort *)(lVar8 + 0x12 + lVar10);
    uVar5 = *(ushort *)(lVar8 + 0x14 + lVar10);
    iVar12 = (int)*(short *)(lVar8 + 0x18 + lVar10);
    iVar13 = (int)*(short *)(lVar8 + 0x1c + lVar10);
    buffer = *(FT_Byte **)(lVar8 + 0x20 + lVar10);
    iVar6 = *(int *)(lVar8 + 0x28 + lVar10);
    (slot->bitmap).rows = (uint)*(ushort *)(lVar8 + 0x16 + lVar10);
    (slot->bitmap).width = (uint)uVar5;
    (slot->bitmap).pitch = iVar6;
    ft_glyphslot_set_bitmap(slot,buffer);
    switch(uVar3) {
    case 1:
      (slot->bitmap).pixel_mode = '\x01';
      break;
    case 2:
      (slot->bitmap).pixel_mode = '\x03';
      break;
    case 4:
      (slot->bitmap).pixel_mode = '\x04';
      break;
    case 8:
      (slot->bitmap).pixel_mode = '\x02';
      (slot->bitmap).num_grays = 0x100;
    }
    slot->format = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = iVar12;
    slot->bitmap_top = iVar13;
    (slot->metrics).horiAdvance = (ulong)uVar4 << 6;
    (slot->metrics).horiBearingX = (long)iVar12 << 6;
    (slot->metrics).horiBearingY = (long)iVar13 << 6;
    uVar1 = (slot->bitmap).rows;
    uVar2 = (slot->bitmap).width;
    uVar16 = 0;
    uVar14 = uVar2 << 6;
    auVar15._0_8_ = CONCAT44(uVar16,uVar14);
    auVar15._8_4_ = uVar1 * 0x40;
    auVar15._12_4_ = 0;
    (slot->metrics).width = auVar15._0_8_;
    (slot->metrics).height = auVar15._8_8_;
    ft_synthesize_vertical_metrics
              (&slot->metrics,(ulong)*(ushort *)(pFVar7[1].face_flags + 10) << 6);
    FVar9 = 0;
  }
  return FVar9;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    BDF_Face     bdf    = (BDF_Face)FT_SIZE_FACE( size );
    FT_Face      face   = FT_FACE( bdf );
    FT_Error     error  = FT_Err_Ok;
    FT_Bitmap*   bitmap = &slot->bitmap;
    bdf_glyph_t  glyph;
    int          bpp    = bdf->bdffont->bpp;

    FT_UNUSED( load_flags );


    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "BDF_Glyph_Load: glyph index %d\n", glyph_index ));

    /* index 0 is the undefined glyph */
    if ( glyph_index == 0 )
      glyph_index = bdf->default_glyph;
    else
      glyph_index--;

    /* slot, bitmap => freetype, glyph => bdflib */
    glyph = bdf->bdffont->glyphs[glyph_index];

    bitmap->rows  = glyph.bbx.height;
    bitmap->width = glyph.bbx.width;
    if ( glyph.bpr > FT_INT_MAX )
      FT_TRACE1(( "BDF_Glyph_Load: too large pitch %d is truncated\n",
                   glyph.bpr ));
    bitmap->pitch = (int)glyph.bpr; /* same as FT_Bitmap.pitch */

    /* note: we don't allocate a new array to hold the bitmap; */
    /*       we can simply point to it                         */
    ft_glyphslot_set_bitmap( slot, glyph.bitmap );

    switch ( bpp )
    {
    case 1:
      bitmap->pixel_mode = FT_PIXEL_MODE_MONO;
      break;
    case 2:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY2;
      break;
    case 4:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY4;
      break;
    case 8:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY;
      bitmap->num_grays  = 256;
      break;
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = glyph.bbx.x_offset;
    slot->bitmap_top  = glyph.bbx.ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( glyph.dwidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( glyph.bbx.x_offset * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( glyph.bbx.ascent * 64 );
    slot->metrics.width        = (FT_Pos)( bitmap->width * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    /*
     * XXX DWIDTH1 and VVECTOR should be parsed and
     * used here, provided such fonts do exist.
     */
    ft_synthesize_vertical_metrics( &slot->metrics,
                                    bdf->bdffont->bbx.height * 64 );

  Exit:
    return error;
  }